

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitBitVector.h
# Opt level: O3

BVIndex BVUnitT<unsigned_long>::CountBit(UnitWord64 bits)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar8;
  undefined1 auVar7 [16];
  
  uVar6 = (uint)(bits >> 0x20);
  uVar6 = uVar6 - (uVar6 >> 1 & 0x55555555);
  uVar8 = (uint)bits - ((uint)bits >> 1 & 0x55555555);
  uVar6 = (uVar6 & 0x33333333) + (uVar6 >> 2 & 0x33333333);
  uVar8 = (uVar8 & 0x33333333) + (uVar8 >> 2 & 0x33333333);
  uVar6 = (uVar6 & 0x7070707) + (uVar6 >> 4 & 0x7070707);
  uVar8 = (uVar8 & 0x7070707) + (uVar8 >> 4 & 0x7070707);
  uVar6 = (uVar6 >> 8) + uVar6;
  uVar8 = (uVar8 >> 8) + uVar8;
  auVar7._0_4_ = (uVar6 >> 0x10) + uVar6;
  auVar7._4_4_ = (uVar8 >> 0x10) + uVar8;
  auVar7._8_8_ = 0;
  auVar7 = phaddd(auVar7 & _DAT_00fd7f90,auVar7 & _DAT_00fd7f90);
  uVar5 = bits - (bits >> 1 & 0x5555555555555555);
  uVar5 = (uVar5 & 0x3333333333333333) + (uVar5 >> 2 & 0x3333333333333333);
  uVar5 = (uVar5 & 0x707070707070707) + (uVar5 >> 4 & 0x707070707070707);
  uVar5 = (uVar5 >> 8) + uVar5;
  lVar4 = (uVar5 >> 0x10) + uVar5;
  uVar6 = (int)((ulong)lVar4 >> 0x20) + (int)lVar4 & 0xff;
  if (uVar6 != auVar7._0_4_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/UnitBitVector.h"
                       ,0xa8,"(countBits == (bits & 0xff))","Wrong count?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return uVar6;
}

Assistant:

static BVIndex CountBit(UnitWord64 bits)
    {
#if DBG
        unsigned countBits = CountBit((UnitWord32)bits) + CountBit((UnitWord32)(bits >> 32));
#endif

        const uint64 _5_64 =     0x5555555555555555ui64;
        const uint64 _3_64 =     0x3333333333333333ui64;
        const uint64 _F1_64 =    0x0f0f0f0f0f0f0f0fui64;

        // In-place adder tree: perform 32 1-bit adds, 16 2-bit adds, 8 4-bit adds,
        // 4 8-bit adds, 2 16-bit adds, and 1 32-bit add.
        // From Dr. Dobb's Nov. 2000 letters, from Phil Bagwell, on reducing
        // the cost by removing some of the masks that can be "forgotten" due
        // to the max # of bits set (64) that will fit in a byte.
        //

        bits -= (bits >> 1) & _5_64;
        bits = ((bits >> 2) & _3_64)  + (bits & _3_64);
        bits = ((bits >> 4) & _F1_64) + (bits & _F1_64);
        bits += bits >> 8;
        bits += bits >> 16;
        bits += bits >> 32;

        AssertMsg(countBits == (bits & 0xff), "Wrong count?");

        return (BVIndex)(bits & 0xff);
    }